

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPlaceholderExpander.cxx
# Opt level: O0

string * __thiscall cmPlaceholderExpander::ExpandVariables(cmPlaceholderExpander *this,string *s)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  char cVar6;
  bool bVar7;
  bool local_119;
  string local_f8 [39];
  bool local_d1;
  string local_d0 [7];
  bool consecutive;
  string local_b0 [8];
  string replace;
  string var;
  char c;
  size_type end;
  string expandedInput;
  size_type pos;
  size_type start;
  string *s_local;
  cmPlaceholderExpander *this_local;
  
  cVar6 = (char)s;
  pos = std::__cxx11::string::find(cVar6,0x3c);
  if (pos != 0xffffffffffffffff) {
    expandedInput.field_2._8_8_ = 0;
    std::__cxx11::string::string((string *)&end);
    while( true ) {
      bVar7 = false;
      if (pos != 0xffffffffffffffff) {
        lVar3 = std::__cxx11::string::size();
        bVar7 = pos < lVar3 - 2U;
      }
      if (!bVar7) {
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_f8,(ulong)s);
        std::__cxx11::string::operator+=((string *)&end,local_f8);
        std::__cxx11::string::~string(local_f8);
        std::__cxx11::string::operator=((string *)s,(string *)&end);
        goto LAB_00789290;
      }
      lVar3 = std::__cxx11::string::find(cVar6,0x3e);
      if (lVar3 == -1) break;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)s);
      iVar1 = isalpha((int)*pcVar4);
      if (iVar1 == 0) {
        pos = std::__cxx11::string::find(cVar6,0x3c);
      }
      else {
        std::__cxx11::string::substr((ulong)((long)&replace.field_2 + 8),(ulong)s);
        (*this->_vptr_cmPlaceholderExpander[2])
                  (local_b0,this,(undefined1 *)((long)&replace.field_2 + 8));
        std::__cxx11::string::substr((ulong)local_d0,(ulong)s);
        std::__cxx11::string::operator+=((string *)&end,local_d0);
        std::__cxx11::string::~string(local_d0);
        uVar2 = std::__cxx11::string::empty();
        local_119 = false;
        if (((uVar2 & 1) != 0) && (local_119 = false, pos != 0)) {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)s);
          local_119 = false;
          if (*pcVar4 == ' ') {
            uVar5 = std::__cxx11::string::size();
            local_119 = false;
            if (lVar3 + 1U < uVar5) {
              pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)s);
              local_119 = *pcVar4 == ' ';
            }
          }
        }
        local_d1 = local_119;
        if (local_119 != false) {
          std::__cxx11::string::pop_back();
        }
        std::__cxx11::string::operator+=((string *)&end,local_b0);
        std::__cxx11::string::size();
        pos = std::__cxx11::string::find(cVar6,0x3c);
        expandedInput.field_2._8_8_ = lVar3 + 1;
        std::__cxx11::string::~string(local_b0);
        std::__cxx11::string::~string((string *)(replace.field_2._M_local_buf + 8));
      }
    }
    std::__cxx11::string::operator=((string *)s,(string *)&end);
LAB_00789290:
    std::__cxx11::string::~string((string *)&end);
  }
  return s;
}

Assistant:

std::string& cmPlaceholderExpander::ExpandVariables(std::string& s)
{
  std::string::size_type start = s.find('<');
  // no variables to expand
  if (start == std::string::npos) {
    return s;
  }
  std::string::size_type pos = 0;
  std::string expandedInput;
  while (start != std::string::npos && start < s.size() - 2) {
    std::string::size_type end = s.find('>', start);
    // if we find a < with no > we are done
    if (end == std::string::npos) {
      s = expandedInput;
      return s;
    }
    char c = s[start + 1];
    // if the next char after the < is not A-Za-z then
    // skip it and try to find the next < in the string
    if (!isalpha(c)) {
      start = s.find('<', start + 1);
    } else {
      // extract the var
      std::string var = s.substr(start + 1, end - start - 1);
      std::string replace = this->ExpandVariable(var);
      expandedInput += s.substr(pos, start - pos);

      // Prevent consecutive whitespace in the output if the rule variable
      // expands to an empty string.
      bool consecutive = replace.empty() && start > 0 && s[start - 1] == ' ' &&
        end + 1 < s.size() && s[end + 1] == ' ';
      if (consecutive) {
        expandedInput.pop_back();
      }

      expandedInput += replace;

      // move to next one
      start = s.find('<', start + var.size() + 2);
      pos = end + 1;
    }
  }
  // add the rest of the input
  expandedInput += s.substr(pos, s.size() - pos);
  s = expandedInput;

  return s;
}